

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::AdvancedSharedIndexing::Run(AdvancedSharedIndexing *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [14];
  unkbyte10 Var6;
  undefined1 auVar7 [12];
  bool bVar8;
  int i;
  GLuint GVar9;
  GLint GVar10;
  undefined4 extraout_EAX;
  ulong uVar11;
  bool *compile_error;
  size_t i_1;
  long lVar12;
  ulong uVar13;
  int iVar14;
  undefined1 extraout_XMM0_Ba;
  undefined1 extraout_XMM0_Bb;
  undefined1 extraout_XMM0_Bc;
  undefined1 extraout_XMM0_Bd;
  undefined1 extraout_XMM0_Be;
  undefined1 extraout_XMM0_Bf;
  undefined1 extraout_XMM0_Bg;
  undefined1 extraout_XMM0_Bh;
  undefined2 uVar29;
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  allocator_type local_a9;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colorData;
  GLfloat values [16];
  Vector<float,_4> local_38;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar21 [16];
  undefined1 auVar15 [16];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)values,
             "\nlayout(binding = 3, rgba8) uniform mediump writeonly image2D g_result_image;\nlayout (local_size_x = 4,local_size_y=4 ) in;\nshared vec4 g_shared1[4];\nshared mat4 g_shared2;\nshared struct {\n  float data[4];\n} g_shared3[4];\nshared struct Type { float data[4]; } g_shared4[4];\nshared Type g_shared5[4];\nuniform bool g_true;\nuniform float g_values[16];\n\nvoid Sync() {\n  groupMemoryBarrier();\n  barrier();\n}\nvoid SetMemory(ivec2 xy, float value) {\n  g_shared1[xy.y][gl_LocalInvocationID.x] = value;\n  g_shared2[xy.y][xy.x] = value;\n  g_shared3[xy[1]].data[xy[0]] = value;\n  g_shared4[xy.y].data[xy[0]] = value;\n  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;\n}\nbool CheckMemory(ivec2 xy, float expected) {\n  if (g_shared1[xy.y][xy[0]] != expected) return false;\n  if (g_shared2[xy[1]][xy[0]] != expected) return false;\n  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;\n  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;\n  if (g_shared5[xy.y].data[xy.x] != expected) return false;\n  return true;\n}\nvoid main() {\n  ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  vec4 result = vec4(0.0, 1.0, 0.0, 1.0);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n\n  if (g_true && gl_LocalInvocationID.x < 10u) {\n    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);\n    Sync();\n    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n  }\n\n  imageStore(g_result_image, thread_xy, result);\n}"
             ,(allocator<char> *)&data_1);
  GVar9 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)values);
  this->m_program = GVar9;
  std::__cxx11::string::~string((string *)values);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar8 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar8) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)values,0x40,(allocator_type *)&data_1);
    textures = &this->m_texture;
    glu::CallLogWrapper::glGenTextures(this_00,1,textures);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,4,4);
    glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0,0,4,4,0x1908,0x1401,(void *)values._0_8_)
    ;
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)values);
    glu::CallLogWrapper::glBindImageTexture(this_00,3,this->m_texture,0,'\0',0,0x88b9,0x8058);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    GVar10 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_true");
    glu::CallLogWrapper::glUniform1i(this_00,GVar10,1);
    values[0xc] = 13.0;
    values[0xd] = 14.0;
    values[0xe] = 15.0;
    values[0xf] = 16.0;
    values[8] = 9.0;
    values[9] = 10.0;
    values[10] = 11.0;
    values[0xb] = 12.0;
    values[4] = 5.0;
    values[5] = 6.0;
    values[6] = 7.0;
    values[7] = 8.0;
    values[0] = 1.0;
    values[1] = 2.0;
    values[2] = 3.0;
    values[3] = 4.0;
    GVar10 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_values");
    glu::CallLogWrapper::glUniform1fv(this_00,GVar10,0x10,values);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data_1,0x10,(allocator_type *)&colorData);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_fbo);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,*textures,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&colorData,0x40,&local_a9);
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,4,4,0x1908,0x1401,
               colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    auVar2 = _DAT_016851b0;
    uVar3 = CONCAT13(extraout_XMM0_Bd,
                     CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))) ^
            CONCAT13(extraout_XMM0_Bd,
                     CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba)));
    uVar4 = CONCAT13(extraout_XMM0_Bh,
                     CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be))) ^
            CONCAT13(extraout_XMM0_Bh,
                     CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be)));
    for (uVar11 = 0; uVar11 < 0x40; uVar11 = uVar11 + 4) {
      uVar1 = *(uint *)(colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar11);
      auVar28._0_15_ = ZEXT415(uVar1);
      auVar28[0xf] = (char)(uVar4 >> 0x18);
      auVar21._14_2_ = auVar28._14_2_;
      auVar21._0_13_ = ZEXT413(uVar1);
      auVar21[0xd] = (char)(uVar4 >> 0x10);
      auVar26._13_3_ = auVar21._13_3_;
      auVar26._0_13_ = ZEXT413(uVar1);
      auVar20._12_4_ = auVar26._12_4_;
      auVar20._4_7_ = 0;
      auVar20._0_4_ = uVar1;
      auVar20[0xb] = (char)(uVar4 >> 8);
      auVar19._11_5_ = auVar20._11_5_;
      auVar19._4_7_ = 0;
      auVar19._0_4_ = uVar1;
      auVar18._10_6_ = auVar19._10_6_;
      auVar18._4_5_ = 0;
      auVar18._0_4_ = uVar1;
      auVar18[9] = (char)uVar4;
      auVar17._9_7_ = auVar18._9_7_;
      auVar17._4_5_ = 0;
      auVar17._0_4_ = uVar1;
      Var6 = CONCAT91(CONCAT81(auVar17._8_8_,(char)(uVar3 >> 0x18)),(char)(uVar1 >> 0x18));
      auVar16._6_10_ = Var6;
      auVar16[5] = (char)(uVar3 >> 0x10);
      auVar16[4] = (char)(uVar1 >> 0x10);
      auVar16._0_4_ = uVar1;
      auVar5._2_12_ = auVar16._4_12_;
      auVar5[1] = (char)(uVar3 >> 8);
      auVar5[0] = (char)(uVar1 >> 8);
      uVar29 = CONCAT11((char)uVar3,(char)uVar1);
      auVar15._2_14_ = auVar5;
      auVar24._0_12_ = auVar15._0_12_;
      auVar24._12_2_ = (short)Var6;
      auVar24._14_2_ = (short)(uVar4 >> 0x10);
      auVar23._12_4_ = auVar24._12_4_;
      auVar23._0_10_ = auVar15._0_10_;
      auVar23._10_2_ = (short)uVar4;
      auVar22._10_6_ = auVar23._10_6_;
      auVar22._0_8_ = auVar15._0_8_;
      auVar22._8_2_ = auVar16._4_2_;
      auVar7._4_8_ = auVar22._8_8_;
      auVar7._2_2_ = (short)(uVar3 >> 0x10);
      auVar7._0_2_ = auVar5._0_2_;
      auVar27._0_8_ = (double)CONCAT22((short)uVar3,uVar29);
      auVar27._8_8_ = (double)auVar7._0_4_;
      auVar25._0_8_ = (double)auVar22._8_4_;
      auVar25._8_8_ = (double)auVar23._12_4_;
      auVar26 = divpd(auVar25,auVar2);
      auVar28 = divpd(auVar27,auVar2);
      *(ulong *)((data_1.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data + uVar11) =
           CONCAT44((float)auVar28._8_8_,(float)auVar28._0_8_);
      *(ulong *)((data_1.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data + uVar11 + 2) =
           CONCAT44((float)auVar26._8_8_,(float)auVar26._0_8_);
    }
    lVar12 = 0;
    uVar11 = 0;
    while( true ) {
      uVar13 = (long)data_1.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)data_1.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (uVar13 <= uVar11) break;
      tcu::Vector<float,_4>::Vector
                (&local_38,
                 (Vector<float,_4> *)
                 ((long)(data_1.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12));
      iVar14 = -(uint)(local_38.m_data[1] != 1.0);
      auVar2[4] = (char)iVar14;
      auVar2._0_4_ = -(uint)(local_38.m_data[0] != 0.0);
      auVar2[5] = (char)((uint)iVar14 >> 8);
      auVar2[6] = (char)((uint)iVar14 >> 0x10);
      auVar2[7] = (char)((uint)iVar14 >> 0x18);
      auVar2._8_4_ = -(uint)(local_38.m_data[2] != 0.0);
      auVar2._12_4_ = -(uint)(local_38.m_data[3] != 1.0);
      iVar14 = movmskps(extraout_EAX,auVar2);
      if (iVar14 != 0) {
        anon_unknown_0::Output("Invalid data at index %d.\n",uVar11);
        break;
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x10;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&data_1.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    lVar12 = -(ulong)(uVar11 < uVar13);
  }
  else {
    lVar12 = -1;
  }
  return lVar12;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(binding = 3, rgba8) uniform mediump writeonly image2D g_result_image;" NL
			   "layout (local_size_x = 4,local_size_y=4 ) in;" NL "shared vec4 g_shared1[4];" NL
			   "shared mat4 g_shared2;" NL "shared struct {" NL "  float data[4];" NL "} g_shared3[4];" NL
			   "shared struct Type { float data[4]; } g_shared4[4];" NL "shared Type g_shared5[4];" NL
			   "uniform bool g_true;" NL "uniform float g_values[16];" NL NL "void Sync() {" NL
			   "  groupMemoryBarrier();" NL "  barrier();" NL "}" NL "void SetMemory(ivec2 xy, float value) {" NL
			   "  g_shared1[xy.y][gl_LocalInvocationID.x] = value;" NL "  g_shared2[xy.y][xy.x] = value;" NL
			   "  g_shared3[xy[1]].data[xy[0]] = value;" NL "  g_shared4[xy.y].data[xy[0]] = value;" NL
			   "  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;" NL "}" NL
			   "bool CheckMemory(ivec2 xy, float expected) {" NL
			   "  if (g_shared1[xy.y][xy[0]] != expected) return false;" NL
			   "  if (g_shared2[xy[1]][xy[0]] != expected) return false;" NL
			   "  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;" NL
			   "  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;" NL
			   "  if (g_shared5[xy.y].data[xy.x] != expected) return false;" NL "  return true;" NL "}" NL
			   "void main() {" NL "  ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
			   "  vec4 result = vec4(0.0, 1.0, 0.0, 1.0);" NL NL
			   "  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);" NL "  Sync();" NL
			   "  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1.0, 0.0, 0.0, "
			   "1.0);" NL NL "  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);" NL "  Sync();" NL
			   "  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1.0, 0.0, 0.0, "
			   "1.0);" NL NL "  if (g_true && gl_LocalInvocationID.x < 10u) {" NL
			   "    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);" NL "    Sync();" NL
			   "    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1.0, 0.0, 0.0, "
			   "1.0);" NL "  }" NL NL "  imageStore(g_result_image, thread_xy, result);" NL "}";

		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init texture */
		{
			std::vector<GLint> data(4 * 4 * 4);
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 4, 4);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glBindImageTexture(3, m_texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);
		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_true"), GL_TRUE);
		GLfloat values[16] = { 1.f, 2.f, 3.f, 4.f, 5.f, 6.f, 7.f, 8.f, 9.f, 10.f, 11.f, 12.f, 13.f, 14.f, 15.f, 16.f };
		glUniform1fv(glGetUniformLocation(m_program, "g_values"), 16, values);
		glDispatchCompute(1, 1, 1);

		/* validate render target */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(0, 1, 0, 1)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}